

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t _elemsize;
  int *piVar9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  pointer pMVar13;
  int iVar14;
  undefined4 uVar15;
  undefined7 uVar17;
  ulong uVar16;
  int iVar18;
  int iVar19;
  Allocator *pAVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  void *pvVar24;
  int h;
  void *pvVar25;
  long lVar26;
  int _woffset;
  int _hoffset;
  ulong local_190;
  ulong local_188;
  int _outc;
  undefined4 local_178;
  int _outw;
  int _outd;
  int _outh;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat m_1;
  long local_c8;
  int _coffset;
  Option *local_b0;
  int local_a8;
  int _doffset;
  Mat *local_a0;
  Mat m_2;
  
  iVar1 = bottom_blob->w;
  iVar19 = bottom_blob->h;
  local_a8 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  local_188 = (ulong)(uint)bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  local_b0 = opt;
  local_a0 = top_blob;
  if (((this->starts_expr)._M_string_length != 0) && ((this->ends_expr)._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs,1,(allocator_type *)&m_1);
    pMVar13 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != bottom_blob) {
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if ((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            if ((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->data != (void *)0x0) {
              free((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
          }
          else {
            (*(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar13->cstep = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      pMVar13->c = 0;
      piVar9 = bottom_blob->refcount;
      pMVar13->data = bottom_blob->data;
      pMVar13->refcount = piVar9;
      pMVar13->elemsize = bottom_blob->elemsize;
      pMVar13->elempack = bottom_blob->elempack;
      pMVar13->allocator = bottom_blob->allocator;
      iVar14 = bottom_blob->w;
      iVar3 = bottom_blob->h;
      iVar4 = bottom_blob->d;
      pMVar13->dims = bottom_blob->dims;
      pMVar13->w = iVar14;
      pMVar13->h = iVar3;
      pMVar13->d = iVar4;
      pMVar13->c = bottom_blob->c;
      pMVar13->cstep = bottom_blob->cstep;
    }
    eval_crop_expr(this,&bottom_blobs,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                   &_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs);
    goto LAB_0027b4ce;
  }
  switch(bottom_blob->dims) {
  case 1:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  case 2:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  case 3:
    goto LAB_0027b303;
  case 4:
LAB_0027b303:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    break;
  default:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resolve_crop_roi(this,(Mat *)&bottom_blobs,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,
                   &_outd,&_outc);
  top_blob = local_a0;
  piVar9 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,
                           bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if ((*piVar9 == 0) &&
       (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_0027b4ce:
  iVar14 = (int)local_188;
  if (iVar14 == 3) {
LAB_0027b706:
    if (_outc == iVar2 && (_outh == iVar19 && _outw == iVar1)) {
      local_190 = local_190 & 0xffffffff00000000;
      if (top_blob == bottom_blob) goto LAB_0027c516;
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = top_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          pvVar25 = top_blob->data;
          pAVar20 = top_blob->allocator;
          goto joined_r0x0027be5d;
        }
      }
      goto LAB_0027c353;
    }
    iVar14 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar4 = bottom_blob->d;
    uVar10 = bottom_blob->elemsize;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)_coffset * bottom_blob->cstep * uVar10 + (long)bottom_blob->data);
    iVar5 = bottom_blob->elempack;
    pAVar20 = bottom_blob->allocator;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar10;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar10 >> 0x20);
    iVar6 = bottom_blob->dims;
    if (_outh != iVar19 || _outw != iVar1) {
      Mat::create(top_blob,_outw,_outh,_outc,_elemsize,local_b0->blob_allocator);
      local_190 = CONCAT44(local_190._4_4_,0xffffff9c);
      if ((top_blob->data == (void *)0x0) ||
         (lVar26 = (long)top_blob->c * top_blob->cstep, lVar26 == 0)) {
        local_178 = 0;
      }
      else {
        uVar17 = (undefined7)((ulong)lVar26 >> 8);
        if (_outc < 1) {
          local_178 = (undefined4)CONCAT71(uVar17,1);
        }
        else {
          local_178 = (undefined4)CONCAT71(uVar17,1);
          lVar26 = 0;
          do {
            lVar22 = (long)iVar14;
            uVar21 = CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            m_1.data = (void *)((long)&(bottom_blobs.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data +
                               (((long)iVar4 * uVar10 * (long)iVar3 * (long)iVar14 + 0xf &
                                0xfffffffffffffff0) / uVar10) * lVar26 * uVar21);
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ =
                 bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_;
            m_1.elemsize._4_4_ =
                 bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
            m_1.d = 1;
            m_1.w = iVar14;
            m_1.dims = iVar6 + -1;
            m_1.cstep = (uVar21 * iVar3 * lVar22 + 0xf & 0xfffffffffffffff0) / uVar21;
            if (iVar6 == 4) {
              m_1.cstep = iVar3 * lVar22;
            }
            uVar8 = top_blob->w;
            uVar23 = (ulong)(int)uVar8;
            iVar7 = top_blob->h;
            uVar16 = top_blob->elemsize;
            pvVar25 = (void *)(top_blob->cstep * lVar26 * uVar16 + (long)top_blob->data);
            m_2.c = top_blob->d;
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = (undefined4)uVar16;
            m_2.elemsize._4_4_ = (undefined4)(uVar16 >> 0x20);
            m_2.d = 1;
            m_2.w = uVar8;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (uVar16 * (long)iVar7 * uVar23 + 0xf & 0xfffffffffffffff0) / uVar16;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)iVar7 * uVar23;
            }
            m_1.elempack = iVar5;
            m_1.allocator = pAVar20;
            m_1.h = iVar3;
            m_1.c = iVar4;
            m_2.data = pvVar25;
            m_2.h = iVar7;
            if (_elemsize == 4) {
              m_2.d = 1;
              m_2.refcount._4_4_ = 0;
              m_2.refcount._0_4_ = 0;
              m_1.d = 1;
              m_1.refcount._4_4_ = 0;
              m_1.refcount._0_4_ = 0;
              copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
            }
            else if (_elemsize == 2) {
              m_2.d = 1;
              m_2.refcount._4_4_ = 0;
              m_2.refcount._0_4_ = 0;
              m_1.d = 1;
              m_1.refcount._4_4_ = 0;
              m_1.refcount._0_4_ = 0;
              copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
            }
            else if ((_elemsize == 1) && (top_blob = local_a0, 0 < iVar7)) {
              pvVar24 = (void *)((long)m_1.data + uVar21 * lVar22 * (long)_hoffset + (long)_woffset)
              ;
              iVar18 = 0;
              local_190 = uVar23;
              do {
                if ((int)uVar23 < 0xc) {
                  if (0 < (int)uVar8) {
                    uVar21 = 0;
                    do {
                      *(undefined1 *)((long)pvVar25 + uVar21) =
                           *(undefined1 *)((long)pvVar24 + uVar21);
                      uVar21 = uVar21 + 1;
                    } while (uVar8 != uVar21);
                  }
                }
                else {
                  memcpy(pvVar25,pvVar24,(ulong)uVar8);
                  uVar23 = local_190;
                }
                pvVar25 = (void *)((long)pvVar25 + uVar23);
                pvVar24 = (void *)((long)pvVar24 + lVar22);
                iVar18 = iVar18 + 1;
                top_blob = local_a0;
              } while (iVar18 != iVar7);
            }
            m_2.cstep = 0;
            m_2.data = (void *)0x0;
            m_2.refcount._0_4_ = 0;
            m_2.refcount._4_4_ = 0;
            m_2.elemsize._0_4_ = 0;
            m_2.elemsize._4_4_ = 0;
            m_2.elempack = 0;
            m_2.dims = 0;
            m_2.w = 0;
            m_2.h = 0;
            m_2.d = 0;
            m_2.c = 0;
            piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + -1;
              UNLOCK();
              if (*piVar9 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            lVar26 = lVar26 + 1;
          } while (lVar26 < _outc);
        }
      }
    }
    else {
      Mat::clone(&m_1,(__fn *)&bottom_blobs,local_b0->blob_allocator,_outc,
                 (void *)(ulong)(uint)_outh);
      top_blob = local_a0;
      if (&m_1 != local_a0) {
        piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + 1;
          UNLOCK();
        }
        piVar9 = local_a0->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_a0->allocator == (Allocator *)0x0) {
              if (local_a0->data != (void *)0x0) {
                free(local_a0->data);
              }
            }
            else {
              (*local_a0->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = m_1.data;
        top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (top_blob->data == (void *)0x0) {
        local_178 = 0;
        local_190 = CONCAT44(local_190._4_4_,0xffffff9c);
      }
      else {
        local_178 = 0;
        uVar15 = 0xffffff9c;
        if ((long)top_blob->c * top_blob->cstep != 0) {
          uVar15 = 0;
        }
        local_190 = CONCAT44(local_190._4_4_,uVar15);
      }
    }
    piVar9 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,
                             bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_finish._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (pAVar20 == (Allocator *)0x0) {
          if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start);
          }
        }
        else {
          (*pAVar20->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    iVar14 = (int)local_188;
    if ((char)local_178 == '\0') goto LAB_0027c516;
    goto LAB_0027bdd1;
  }
  if (iVar14 == 2) {
LAB_0027b5f7:
    if (_outh != iVar19 || _outw != iVar1) {
      Mat::create(top_blob,_outw,_outh,_elemsize,local_b0->blob_allocator);
      local_190 = CONCAT44(local_190._4_4_,0xffffff9c);
      if ((top_blob->data == (void *)0x0) ||
         (iVar14 = (int)local_188, (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0027c516;
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,top_blob,_hoffset,_woffset);
LAB_0027b6f8:
        iVar14 = (int)local_188;
      }
      else {
        if (_elemsize == 2) {
          copy_cut_border_image<unsigned_short>(bottom_blob,top_blob,_hoffset,_woffset);
          goto LAB_0027b6f8;
        }
        if (_elemsize == 1) {
          copy_cut_border_image<signed_char>(bottom_blob,top_blob,_hoffset,_woffset);
          goto LAB_0027b6f8;
        }
      }
      if (iVar14 == 3) goto LAB_0027b706;
      goto LAB_0027bdd1;
    }
    local_190 = local_190 & 0xffffffff00000000;
    if (top_blob == bottom_blob) goto LAB_0027c516;
    piVar9 = bottom_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    piVar9 = top_blob->refcount;
    if (piVar9 == (int *)0x0) goto LAB_0027c353;
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 != 0) goto LAB_0027c353;
    pvVar25 = top_blob->data;
    pAVar20 = top_blob->allocator;
    if (pAVar20 == (Allocator *)0x0) goto joined_r0x0027b65e;
LAB_0027be63:
    (*pAVar20->_vptr_Allocator[3])();
  }
  else {
    if (iVar14 != 1) {
LAB_0027bdd1:
      if (iVar14 == 4) {
        if (_outc == iVar2 && (local_a8 == _outd && (iVar19 == _outh && iVar1 == _outw))) {
          local_190 = local_190 & 0xffffffff00000000;
          if (top_blob == bottom_blob) goto LAB_0027c516;
          piVar9 = bottom_blob->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          piVar9 = top_blob->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              pvVar25 = top_blob->data;
              pAVar20 = top_blob->allocator;
              goto joined_r0x0027be5d;
            }
          }
          goto LAB_0027c353;
        }
        local_188 = CONCAT44(local_188._4_4_,_outh);
        iVar2 = bottom_blob->w;
        iVar14 = bottom_blob->h;
        iVar3 = bottom_blob->d;
        uVar10 = bottom_blob->elemsize;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)_coffset * bottom_blob->cstep * uVar10 + (long)bottom_blob->data);
        iVar4 = bottom_blob->elempack;
        pAVar20 = bottom_blob->allocator;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar10;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar10 >> 0x20);
        if (local_a8 != _outd || (iVar19 != _outh || iVar1 != _outw)) {
          Mat::create(top_blob,_outw,_outh,_outd,_outc,_elemsize,local_b0->blob_allocator);
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_0027c4aa;
          if (0 < _outc) {
            local_c8 = 0;
            do {
              if (0 < _outd) {
                lVar26 = 0;
                do {
                  m_1.cstep = (long)iVar14 * (long)iVar2;
                  m_1.data = (void *)((long)&(bottom_blobs.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->data +
                                     ((long)(int)lVar26 + (long)_doffset) *
                                     CONCAT44(bottom_blobs.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_,bottom_blobs.
                                                                                                        
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_) * m_1.cstep +
                                     (((long)iVar3 * uVar10 * (long)iVar14 * (long)iVar2 + 0xf &
                                      0xfffffffffffffff0) / uVar10) * local_c8 *
                                     CONCAT44(bottom_blobs.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_,bottom_blobs.
                                                                                                        
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_));
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ =
                       bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
                  m_1.elemsize._4_4_ =
                       bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                  m_1.w = iVar2;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  uVar8 = local_a0->w;
                  sVar11 = local_a0->elemsize;
                  iVar1 = local_a0->h;
                  m_2.elempack = local_a0->elempack;
                  m_2.cstep = (long)iVar1 * (long)(int)uVar8;
                  pvVar25 = (void *)((long)local_a0->data +
                                    lVar26 * sVar11 * m_2.cstep +
                                    local_a0->cstep * local_c8 * sVar11);
                  m_2.allocator = local_a0->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)sVar11;
                  m_2.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
                  m_2.w = uVar8;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  m_1.elempack = iVar4;
                  m_1.allocator = pAVar20;
                  m_1.h = iVar14;
                  m_2.data = pvVar25;
                  m_2.h = iVar1;
                  if (_elemsize == 4) {
                    m_2.c = 1;
                    m_2.d = 1;
                    m_2.refcount._4_4_ = 0;
                    m_2.refcount._0_4_ = 0;
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if (_elemsize == 2) {
                    m_2.c = 1;
                    m_2.d = 1;
                    m_2.refcount._4_4_ = 0;
                    m_2.refcount._0_4_ = 0;
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if ((_elemsize == 1) && (0 < iVar1)) {
                    uVar21 = (ulong)(int)uVar8;
                    pvVar24 = (void *)((long)m_1.data +
                                      (long)_woffset +
                                      (long)_hoffset * (long)iVar2 *
                                      CONCAT44(bottom_blobs.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _4_4_,bottom_blobs.
                                                                                                          
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_));
                    iVar19 = 0;
                    local_188 = uVar21;
                    do {
                      if ((int)uVar8 < 0xc) {
                        if (0 < (int)uVar21) {
                          uVar16 = 0;
                          do {
                            *(undefined1 *)((long)pvVar25 + uVar16) =
                                 *(undefined1 *)((long)pvVar24 + uVar16);
                            uVar16 = uVar16 + 1;
                          } while (uVar8 != uVar16);
                        }
                      }
                      else {
                        memcpy(pvVar25,pvVar24,(ulong)uVar8);
                        uVar21 = local_188;
                      }
                      pvVar25 = (void *)((long)pvVar25 + uVar21);
                      pvVar24 = (void *)((long)pvVar24 + (long)iVar2);
                      iVar19 = iVar19 + 1;
                    } while (iVar19 != iVar1);
                  }
                  piVar9 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + -1;
                    UNLOCK();
                    if (*piVar9 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        if (m_2.data != (void *)0x0) {
                          free(m_2.data);
                        }
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + -1;
                    UNLOCK();
                    if (*piVar9 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar26 = lVar26 + 1;
                } while (lVar26 < _outd);
              }
              local_c8 = local_c8 + 1;
            } while (local_c8 < _outc);
          }
          bVar12 = true;
        }
        else {
          Mat::clone(&m_1,(__fn *)&bottom_blobs,local_b0->blob_allocator,_outd,
                     (void *)(ulong)(uint)_outc);
          if (&m_1 != top_blob) {
            piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + 1;
              UNLOCK();
            }
            piVar9 = top_blob->refcount;
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + -1;
              UNLOCK();
              if (*piVar9 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = m_1.data;
            top_blob->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            top_blob->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar12 = false;
          if (top_blob->data == (void *)0x0) {
LAB_0027c4aa:
            bVar12 = false;
            local_190 = CONCAT44(local_190._4_4_,0xffffff9c);
          }
          else {
            uVar15 = 0xffffff9c;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              uVar15 = 0;
            }
            local_190 = CONCAT44(local_190._4_4_,uVar15);
          }
        }
        piVar9 = (int *)CONCAT44(bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (pAVar20 == (Allocator *)0x0) {
              if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start);
              }
            }
            else {
              (*pAVar20->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar12) goto LAB_0027c516;
      }
      local_190 = 0;
      goto LAB_0027c516;
    }
    if (_outw != iVar1) {
      Mat::create(top_blob,_outw,_elemsize,local_b0->blob_allocator);
      local_190 = CONCAT44(local_190._4_4_,0xffffff9c);
      if ((top_blob->data == (void *)0x0) ||
         (iVar14 = (int)local_188, (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0027c516;
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,top_blob,0,_woffset);
LAB_0027b5e0:
        iVar14 = (int)local_188;
      }
      else {
        if (_elemsize == 2) {
          copy_cut_border_image<unsigned_short>(bottom_blob,top_blob,0,_woffset);
          goto LAB_0027b5e0;
        }
        if (_elemsize == 1) {
          copy_cut_border_image<signed_char>(bottom_blob,top_blob,0,_woffset);
          goto LAB_0027b5e0;
        }
      }
      if (iVar14 == 3) goto LAB_0027b706;
      if (iVar14 == 2) goto LAB_0027b5f7;
      goto LAB_0027bdd1;
    }
    local_190 = local_190 & 0xffffffff00000000;
    if (top_blob == bottom_blob) goto LAB_0027c516;
    piVar9 = bottom_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    piVar9 = top_blob->refcount;
    if (piVar9 == (int *)0x0) goto LAB_0027c353;
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 != 0) goto LAB_0027c353;
    pvVar25 = top_blob->data;
    pAVar20 = top_blob->allocator;
joined_r0x0027be5d:
    if (pAVar20 != (Allocator *)0x0) goto LAB_0027be63;
joined_r0x0027b65e:
    if (pvVar25 != (void *)0x0) {
      free(pvVar25);
    }
  }
LAB_0027c353:
  top_blob->cstep = 0;
  top_blob->data = (void *)0x0;
  top_blob->refcount = (int *)0x0;
  *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
  *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
  top_blob->dims = 0;
  top_blob->w = 0;
  top_blob->h = 0;
  top_blob->d = 0;
  top_blob->c = 0;
  piVar9 = bottom_blob->refcount;
  top_blob->data = bottom_blob->data;
  top_blob->refcount = piVar9;
  top_blob->elemsize = bottom_blob->elemsize;
  top_blob->elempack = bottom_blob->elempack;
  top_blob->allocator = bottom_blob->allocator;
  iVar1 = bottom_blob->w;
  iVar19 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  top_blob->dims = bottom_blob->dims;
  top_blob->w = iVar1;
  top_blob->h = iVar19;
  top_blob->d = iVar2;
  top_blob->c = bottom_blob->c;
  top_blob->cstep = bottom_blob->cstep;
LAB_0027c516:
  return (int)local_190;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blobs(1);
        bottom_blobs[0] = bottom_blob;
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}